

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O3

bool __thiscall helics::CommsInterface::propertyLock(CommsInterface *this)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  
  cVar2 = '\0';
  do {
    LOCK();
    cVar1 = (this->operating)._M_base._M_i;
    bVar3 = cVar2 == cVar1;
    if (bVar3) {
      (this->operating)._M_base._M_i = true;
      cVar1 = cVar2;
    }
    cVar2 = cVar1;
    UNLOCK();
  } while ((!bVar3) && ((this->txStatus)._M_i == STARTUP));
  return bVar3;
}

Assistant:

bool CommsInterface::propertyLock()
{
    bool exp = false;
    while (!operating.compare_exchange_weak(exp, true)) {
        if (txStatus != ConnectionStatus::STARTUP) {
            return false;
        }
    }
    return true;
}